

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

void __thiscall hmi::renderer::draw(renderer *this,vertex *vertices,size_t count,int primitive)

{
  int iVar1;
  int iVar2;
  GLint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  ostream *poVar6;
  GLenum in_ECX;
  GLsizei in_EDX;
  renderer *in_RSI;
  long in_RDI;
  void *color_pointer;
  void *position_pointer;
  GLint color_loc;
  GLint position_loc;
  GLint loc;
  mat3f transform;
  vec2i size;
  renderer *in_stack_ffffffffffffff88;
  PFNGLVIEWPORTPROC p_Var7;
  GLfloat local_48 [9];
  anon_union_8_5_712f1eca_for_vec<int,_2UL>_2 local_24;
  GLenum local_1c;
  GLsizei local_18;
  
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_24.x.data = (vec_accessor<int,_2UL,_0UL>)get_size(in_stack_ffffffffffffff88);
  p_Var7 = glad_glViewport;
  iVar1 = vec_accessor::operator_cast_to_int((vec_accessor *)&local_24.x);
  iVar2 = vec_accessor::operator_cast_to_int((vec_accessor *)&local_24.x);
  (*p_Var7)(0,0,iVar1,iVar2);
  get_view_matrix(in_RSI);
  GVar3 = (*glad_glGetUniformLocation)(*(GLuint *)(in_RDI + 0x20),"u_transform");
  if (GVar3 == -1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Uniform not found");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    (*glad_glUniformMatrix3fv)(GVar3,1,'\0',local_48);
    (*glad_glUseProgram)(*(GLuint *)(in_RDI + 0x20));
    GVar4 = (*glad_glGetAttribLocation)(*(GLuint *)(in_RDI + 0x20),"a_position");
    if (GVar3 == -1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Attribute not found: a_position");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      GVar5 = (*glad_glGetAttribLocation)(*(GLuint *)(in_RDI + 0x20),"a_color");
      if (GVar3 == -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Attribute not found: a_color");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        (*glad_glEnableVertexAttribArray)(GVar4);
        (*glad_glEnableVertexAttribArray)(GVar5);
        (*glad_glVertexAttribPointer)(GVar4,2,0x1406,'\0',0x18,in_RSI);
        (*glad_glVertexAttribPointer)(GVar5,4,0x1406,'\0',0x18,&in_RSI->m_context);
        (*glad_glDrawArrays)(local_1c,0,local_18);
        (*glad_glDisableVertexAttribArray)(GVar4);
        (*glad_glDisableVertexAttribArray)(GVar5);
      }
    }
  }
  return;
}

Assistant:

void renderer::draw(const vertex *vertices, std::size_t count, int primitive) {
    // set viewport

    vec2i size = get_size();
    glViewport(0, 0, size.width, size.height);

    // set transformation matrix

    mat3f transform = get_view_matrix();

    GLint loc = glGetUniformLocation(m_program, "u_transform");

    if (loc == -1) {
      std::cerr << "Uniform not found" << std::endl;
      return;
    }

    glUniformMatrix3fv(loc, 1, GL_FALSE, &transform.data[0][0]);

    // send data

    glUseProgram(m_program);

    GLint position_loc = glGetAttribLocation(m_program, "a_position");

    if (loc == -1) {
      std::cerr << "Attribute not found: a_position" << std::endl;
      return;
    }

    GLint color_loc = glGetAttribLocation(m_program, "a_color");

    if (loc == -1) {
      std::cerr << "Attribute not found: a_color" << std::endl;
      return;
    }

    glEnableVertexAttribArray(position_loc);
    glEnableVertexAttribArray(color_loc);

    const void *position_pointer = &vertices[0].position;
    const void *color_pointer = &vertices[0].color;

    glVertexAttribPointer(position_loc, 2, GL_FLOAT, GL_FALSE, sizeof(vertex), position_pointer);
    glVertexAttribPointer(color_loc, 4, GL_FLOAT, GL_FALSE, sizeof(vertex), color_pointer);

    glDrawArrays(primitive, 0, count);

    glDisableVertexAttribArray(position_loc);
    glDisableVertexAttribArray(color_loc);
  }